

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

node * mpt::node::create(char *ident,int len)

{
  size_t sVar1;
  int local_34;
  node *n;
  size_t need;
  int len_local;
  char *ident_local;
  
  need._4_4_ = len;
  if (len < 0) {
    if (ident == (char *)0x0) {
      local_34 = 0;
    }
    else {
      sVar1 = strlen(ident);
      need._4_4_ = (int)sVar1;
      local_34 = need._4_4_ + 1;
    }
  }
  else {
    local_34 = len + 1;
  }
  n = (node *)(long)local_34;
  ident_local = (char *)create((size_t)n);
  if ((node *)ident_local == (node *)0x0) {
    ident_local = (char *)0x0;
  }
  else {
    identifier::set_name(&((node *)ident_local)->ident,ident,need._4_4_);
  }
  return (node *)ident_local;
}

Assistant:

node *node::create(const char *ident, int len)
{
	size_t need;
	if (len < 0) {
		need = ident ? (len = strlen(ident)) + 1 : 0;
	} else {
		need = len + 1;
	}
	node *n;
	// identifier in extended node data only
	if (!(n = create(need))) {
		return 0;
	}
	n->ident.set_name(ident, len);
	return n;
}